

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int runtest(int i)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *__ptr;
  int *piVar10;
  ulong uVar11;
  glob64_t local_78;
  
  iVar4 = nb_tests;
  iVar3 = nb_leaks;
  iVar2 = nb_errors;
  if ((tests_quiet == '\0') && (testDescriptions[i].desc != (char *)0x0)) {
    printf("## %s\n");
  }
  lVar7 = xmlGetCharEncodingHandler(6);
  lVar8 = xmlGetCharEncodingHandler(0x15);
  if (testDescriptions[i].in == (char *)0x0) {
    testErrorsSize = 0;
    testErrors[0] = '\0';
    extraMemoryFromResolver = 0;
    iVar5 = (*testDescriptions[i].func)
                      ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[i].options);
    if (iVar5 != 0) {
      nb_errors = nb_errors + 1;
    }
  }
  else {
    local_78.gl_offs = 0;
    glob64(testDescriptions[i].in,8,(__errfunc *)0x0,&local_78);
    for (uVar11 = 0; uVar11 < local_78.gl_pathc; uVar11 = uVar11 + 1) {
      iVar5 = checkTestFile(local_78.gl_pathv[uVar11]);
      if (((iVar5 != 0) &&
          ((lVar7 != 0 ||
           (pcVar9 = strstr(local_78.gl_pathv[uVar11],"ebcdic"), pcVar9 == (char *)0x0)))) &&
         ((lVar8 != 0 ||
          (pcVar9 = strstr(local_78.gl_pathv[uVar11],"icu_parse_test"), pcVar9 == (char *)0x0)))) {
        if (testDescriptions[i].suffix == (char *)0x0) {
          pcVar9 = (char *)0x0;
        }
        else {
          pcVar9 = resultFilename(local_78.gl_pathv[uVar11],testDescriptions[i].out,
                                  testDescriptions[i].suffix);
          if (pcVar9 == (char *)0x0) goto LAB_00106ffe;
        }
        if (testDescriptions[i].err == (char *)0x0) {
          __ptr = (char *)0x0;
        }
        else {
          __ptr = resultFilename(local_78.gl_pathv[uVar11],testDescriptions[i].out,
                                 testDescriptions[i].err);
          if (__ptr == (char *)0x0) {
LAB_00106ffe:
            fwrite("Out of memory !\n",0x10,1,_stderr);
            fatalError();
          }
        }
        iVar5 = xmlMemUsed();
        extraMemoryFromResolver = 0;
        testErrorsSize = 0;
        testErrors[0] = '\0';
        iVar6 = (*testDescriptions[i].func)
                          (local_78.gl_pathv[uVar11],pcVar9,__ptr,
                           testDescriptions[i].options | 0x10000);
        xmlResetLastError();
        if (iVar6 == 0) {
          iVar6 = xmlMemUsed();
          if (((iVar6 != iVar5) && (iVar6 = xmlMemUsed(), __stream = _stderr, iVar6 != iVar5)) &&
             (extraMemoryFromResolver == 0)) {
            pcVar1 = local_78.gl_pathv[uVar11];
            iVar6 = xmlMemUsed();
            fprintf(__stream,"File %s leaked %d bytes\n",pcVar1,(ulong)(uint)(iVar6 - iVar5));
            piVar10 = &nb_leaks;
            goto LAB_00106f22;
          }
        }
        else {
          fprintf(_stderr,"File %s generated an error\n",local_78.gl_pathv[uVar11]);
          piVar10 = &nb_errors;
LAB_00106f22:
          *piVar10 = *piVar10 + 1;
        }
        testErrorsSize = 0;
        free(pcVar9);
        free(__ptr);
      }
    }
    globfree64(&local_78);
  }
  xmlCharEncCloseFunc(lVar7);
  iVar5 = xmlCharEncCloseFunc(lVar8);
  if (verbose == '\x01') {
    if (nb_leaks == iVar3 && nb_errors == iVar2) {
      iVar5 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar4));
    }
    else {
      iVar5 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar4),
                     (ulong)(uint)(nb_errors - iVar2),(ulong)(uint)(nb_leaks - iVar3));
    }
  }
  return iVar5;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}